

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelController.cpp
# Opt level: O0

Channel __thiscall cali::ChannelController::create(ChannelController *this)

{
  bool bVar1;
  element_type *peVar2;
  RuntimeConfig *cfg_00;
  ostream *poVar3;
  element_type *peVar4;
  Events *pEVar5;
  caliper_cbvec *pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined8 *in_RSI;
  Channel CVar8;
  anon_class_8_1_8991fb9c local_2a0;
  function<void_(cali::Caliper_*,_cali::Channel_*)> local_298;
  undefined4 local_274;
  Log local_270;
  undefined1 local_68 [24];
  Caliper c;
  undefined1 local_28 [8];
  RuntimeConfig cfg;
  ChannelController *this_local;
  
  peVar2 = std::
           __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_RSI + 1));
  bVar1 = Channel::operator_cast_to_bool(&peVar2->channel);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(in_RSI + 1));
    Channel::Channel((Channel *)this,&peVar2->channel);
    _Var7._M_pi = extraout_RDX;
  }
  else {
    RuntimeConfig::RuntimeConfig((RuntimeConfig *)local_28);
    peVar2 = std::
             __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(in_RSI + 1));
    RuntimeConfig::allow_read_env((RuntimeConfig *)local_28,SUB41((peVar2->flags & 2U) >> 1,0));
    peVar2 = std::
             __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(in_RSI + 1));
    RuntimeConfig::import((RuntimeConfig *)local_28,&peVar2->config);
    Caliper::Caliper((Caliper *)(local_68 + 0x10));
    std::
    __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)(in_RSI + 1));
    cfg_00 = (RuntimeConfig *)std::__cxx11::string::c_str();
    Caliper::create_channel((Caliper *)local_68,local_68 + 0x10,cfg_00);
    peVar2 = std::
             __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(in_RSI + 1));
    Channel::operator=(&peVar2->channel,(Channel *)local_68);
    Channel::~Channel((Channel *)local_68);
    peVar2 = std::
             __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(in_RSI + 1));
    bVar1 = Channel::operator_cast_to_bool(&peVar2->channel);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(in_RSI + 1));
      (**(code **)*in_RSI)(in_RSI,local_68 + 0x10,&peVar2->channel);
      peVar2 = std::
               __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(in_RSI + 1));
      peVar4 = std::
               __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(in_RSI + 1));
      anon_unknown.dwarf_3229a9::add_channel_metadata
                ((Caliper *)(local_68 + 0x10),&peVar2->channel,&peVar4->metadata);
      peVar2 = std::
               __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(in_RSI + 1));
      pEVar5 = Channel::events(&peVar2->channel);
      pcVar6 = &pEVar5->finish_evt;
      std::function<void(cali::Caliper*,cali::Channel*)>::
      function<cali::ChannelController::create()::__0,void>
                ((function<void(cali::Caliper*,cali::Channel*)> *)&local_298,&local_2a0);
      util::callback<void_(cali::Caliper_*,_cali::Channel_*)>::connect
                (&pEVar5->finish_evt,(int)&local_298,__addr,(socklen_t)pcVar6);
      std::function<void_(cali::Caliper_*,_cali::Channel_*)>::~function(&local_298);
      peVar2 = std::
               __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(in_RSI + 1));
      Channel::Channel((Channel *)this,&peVar2->channel);
    }
    else {
      Log::Log(&local_270,0);
      poVar3 = Log::stream(&local_270);
      poVar3 = std::operator<<(poVar3,"ChannelController::create(): Could not create channel ");
      peVar2 = std::
               __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(in_RSI + 1));
      poVar3 = std::operator<<(poVar3,(string *)peVar2);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Log::~Log(&local_270);
      Channel::Channel((Channel *)this);
    }
    local_274 = 1;
    Caliper::~Caliper((Caliper *)(local_68 + 0x10));
    RuntimeConfig::~RuntimeConfig((RuntimeConfig *)local_28);
    _Var7._M_pi = extraout_RDX_00;
  }
  CVar8.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  CVar8.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Channel)CVar8.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Channel ChannelController::create()
{
    if (mP->channel)
        return mP->channel;

    RuntimeConfig cfg;

    cfg.allow_read_env(mP->flags & CALI_CHANNEL_ALLOW_READ_ENV);
    cfg.import(mP->config);

    Caliper c;

    mP->channel = c.create_channel(mP->name.c_str(), cfg);

    if (!mP->channel) {
        Log(0).stream() << "ChannelController::create(): Could not create channel " << mP->name << std::endl;
        return Channel();
    }

    on_create(&c, mP->channel);
    add_channel_metadata(c, mP->channel, mP->metadata);

    //   Reset the object's channel pointer if the channel is destroyed
    // behind our back (e.g., in Caliper::release())
    mP->channel.events().finish_evt.connect([this](Caliper*, Channel*) { mP->channel = Channel(); });

    return mP->channel;
}